

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

size_t lua_objlen(lua_State *L,int idx)

{
  uint uVar1;
  uint uVar2;
  TValue *o;
  GCstr *pGVar3;
  
  o = index2adr(L,idx);
  uVar1 = (o->field_2).it;
  if (uVar1 == 0xfffffff3) {
LAB_0010ef6b:
    pGVar3 = (GCstr *)(ulong)(o->u32).lo;
  }
  else {
    if (uVar1 == 0xfffffff4) {
      uVar2 = lj_tab_len((GCtab *)(ulong)(o->u32).lo);
      goto LAB_0010ef9b;
    }
    if (uVar1 == 0xfffffffb) goto LAB_0010ef6b;
    uVar2 = 0;
    if (0xfffeffff < uVar1) goto LAB_0010ef9b;
    pGVar3 = lj_strfmt_number(L,o);
    (o->u32).lo = (uint32_t)pGVar3;
    (o->field_2).it = 0xfffffffb;
  }
  uVar2 = pGVar3->len;
LAB_0010ef9b:
  return (ulong)uVar2;
}

Assistant:

LUA_API size_t lua_objlen(lua_State *L, int idx)
{
  TValue *o = index2adr(L, idx);
  if (tvisstr(o)) {
    return strV(o)->len;
  } else if (tvistab(o)) {
    return (size_t)lj_tab_len(tabV(o));
  } else if (tvisudata(o)) {
    return udataV(o)->len;
  } else if (tvisnumber(o)) {
    GCstr *s = lj_strfmt_number(L, o);
    setstrV(L, o, s);
    return s->len;
  } else {
    return 0;
  }
}